

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

thread_t embree::createThread(thread_func f,void *arg,size_t stack_size,ssize_t threadID)

{
  int iVar1;
  thread_t __newthread;
  undefined8 *__arg;
  size_t sVar2;
  runtime_error *this;
  cpu_set_t cset;
  pthread_attr_t attr;
  cpu_set_t local_e8;
  pthread_attr_t local_60;
  
  pthread_attr_init(&local_60);
  if (stack_size != 0) {
    pthread_attr_setstacksize(&local_60,stack_size);
  }
  __newthread = (thread_t)operator_new(8);
  __arg = (undefined8 *)operator_new(0x18);
  *__arg = f;
  __arg[1] = arg;
  __arg[2] = (long)(int)threadID;
  iVar1 = pthread_create((pthread_t *)__newthread,&local_60,threadStartup,__arg);
  pthread_attr_destroy(&local_60);
  if (iVar1 == 0) {
    if (-1 < threadID) {
      local_e8.__bits[0xe] = 0;
      local_e8.__bits[0xf] = 0;
      local_e8.__bits[0xc] = 0;
      local_e8.__bits[0xd] = 0;
      local_e8.__bits[10] = 0;
      local_e8.__bits[0xb] = 0;
      local_e8.__bits[8] = 0;
      local_e8.__bits[9] = 0;
      local_e8.__bits[6] = 0;
      local_e8.__bits[7] = 0;
      local_e8.__bits[4] = 0;
      local_e8.__bits[5] = 0;
      local_e8.__bits[2] = 0;
      local_e8.__bits[3] = 0;
      local_e8.__bits[0] = 0;
      local_e8.__bits[1] = 0;
      sVar2 = mapThreadID(threadID);
      if (sVar2 < 0x400) {
        local_e8.__bits[sVar2 >> 6] = local_e8.__bits[sVar2 >> 6] | 1L << ((byte)sVar2 & 0x3f);
      }
      pthread_setaffinity_np(*(pthread_t *)__newthread,0x80,&local_e8);
    }
    return __newthread;
  }
  operator_delete(__newthread);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"pthread_create failed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

thread_t createThread(thread_func f, void* arg, size_t stack_size, ssize_t threadID)
  {
    /* set stack size */
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    if (stack_size > 0) pthread_attr_setstacksize (&attr, stack_size);

    /* create thread */
    pthread_t* tid = new pthread_t;
    if (pthread_create(tid,&attr,(void*(*)(void*))threadStartup,new ThreadStartupData(f,arg,threadID)) != 0) {
      pthread_attr_destroy(&attr);
      delete tid; 
      FATAL("pthread_create failed");
    }
    pthread_attr_destroy(&attr);

    /* set affinity */
#if defined(__LINUX__) && !defined(__ANDROID__)
    if (threadID >= 0) {
      cpu_set_t cset;
      CPU_ZERO(&cset);
      threadID = mapThreadID(threadID);
      CPU_SET(threadID, &cset);
      pthread_setaffinity_np(*tid, sizeof(cset), &cset);
    }
#elif defined(__FreeBSD__)
    if (threadID >= 0) {
      cpuset_t cset;
      CPU_ZERO(&cset);
      CPU_SET(threadID, &cset);
      pthread_setaffinity_np(*tid, sizeof(cset), &cset);
    }
#elif defined(__ANDROID__)
    if (threadID >= 0) {
      cpu_set_t cset;
      CPU_ZERO(&cset);
      CPU_SET(threadID, &cset);
      sched_setaffinity(pthread_gettid_np(*tid), sizeof(cset), &cset);
    }
#endif

    return thread_t(tid);
  }